

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.cpp
# Opt level: O1

void duckdb::TypeOfFunction(DataChunk *args,ExpressionState *state,Vector *result)

{
  reference pvVar1;
  Value v;
  string local_70;
  Value local_50;
  
  pvVar1 = vector<duckdb::Vector,_true>::operator[](&args->data,0);
  LogicalType::ToString_abi_cxx11_(&local_70,&pvVar1->type);
  Value::Value(&local_50,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  Vector::Reference(result,&local_50);
  Value::~Value(&local_50);
  return;
}

Assistant:

static void TypeOfFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	Value v(args.data[0].GetType().ToString());
	result.Reference(v);
}